

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# u64.c
# Opt level: O2

size_t u64CLZ(u64 w)

{
  size_t sVar1;
  ulong uVar2;
  
  uVar2 = w | w >> 1;
  uVar2 = uVar2 | uVar2 >> 2;
  uVar2 = uVar2 | uVar2 >> 4;
  uVar2 = uVar2 | uVar2 >> 8;
  uVar2 = uVar2 | uVar2 >> 0x10;
  sVar1 = u64Weight(~(uVar2 | uVar2 >> 0x20));
  return sVar1;
}

Assistant:

size_t SAFE(u64CLZ)(register u64 w)
{
	w = w | w >> 1;
	w = w | w >> 2;
	w = w | w >> 4;
	w = w | w >> 8;
	w = w | w >> 16;
	w = w | w >> 32;
	return u64Weight(~w);
}